

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  long lVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  string *input_stream;
  char *__s_00;
  bool bVar6;
  int vector_length;
  int codebook_index;
  int index;
  vector<double,_std::allocator<double>_> input_vector;
  ifstream ifs1;
  ifstream ifs2;
  ostringstream error_message_6;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  string local_5f0;
  vector<double,_std::allocator<double>_> local_5d0;
  string local_5b8;
  byte abStack_598 [80];
  ios_base local_548 [408];
  string local_3b0;
  byte abStack_390 [80];
  ios_base local_340 [408];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_5fc = 0x1a;
  local_5f8 = 0;
LAB_001026c4:
  do {
    iVar4 = ya_getopt_long(argc,argv,"l:m:i:h",(option *)0x0,(int *)0x0);
    switch(iVar4) {
    case 0x68:
      anon_unknown.dwarf_2bfd::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
      std::__cxx11::string::string((string *)&local_5b8,ya_optarg,(allocator *)&local_3b0);
      bVar2 = sptk::ConvertStringToInteger(&local_5b8,&local_5f8);
      bVar6 = local_5f8 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p);
      }
      if (!bVar2 || bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_5b8,"The argument for the -i option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_5b8,"non-negative integer",0x14);
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"extract","");
        sptk::PrintErrorMessage(&local_3b0,(ostringstream *)&local_5b8);
        goto LAB_00102ae0;
      }
      break;
    case 0x6c:
      goto switchD_001026ed_caseD_6c;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_5b8,ya_optarg,(allocator *)&local_3b0);
      bVar2 = sptk::ConvertStringToInteger(&local_5b8,&local_5fc);
      bVar6 = local_5fc < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p);
      }
      if (!bVar2 || bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_5b8,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_5b8,"non-negative integer",0x14);
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"extract","");
        sptk::PrintErrorMessage(&local_3b0,(ostringstream *)&local_5b8);
        goto LAB_00102ae0;
      }
      local_5fc = local_5fc + 1;
      break;
    default:
      if (iVar4 == -1) {
        if (argc - ya_optind == 1) {
          lVar1 = (long)argc + -1;
          __s_00 = (char *)0x0;
        }
        else {
          if (argc - ya_optind != 2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_5b8,
                       "Just two input files, idxfile and infile, are required",0x36);
            local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"extract","");
            sptk::PrintErrorMessage(&local_3b0,(ostringstream *)&local_5b8);
            goto LAB_00102ae0;
          }
          lVar1 = (long)argc + -2;
          __s_00 = argv[(long)argc + -1];
        }
        __s = argv[lVar1];
        bVar2 = sptk::SetBinaryMode();
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_5b8,"Cannot set translation mode",0x1b);
          local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"extract","");
          sptk::PrintErrorMessage(&local_3b0,(ostringstream *)&local_5b8);
          goto LAB_00102ae0;
        }
        std::ifstream::ifstream(&local_5b8);
        std::ifstream::open((char *)&local_5b8,(_Ios_Openmode)__s);
        if ((abStack_598[*(long *)(local_5b8._M_dataplus._M_p + -0x18)] & 5) == 0) {
          input_stream = &local_3b0;
          std::ifstream::ifstream(input_stream);
          if ((__s_00 == (char *)0x0) ||
             (std::ifstream::open((char *)&local_3b0,(_Ios_Openmode)__s_00),
             (abStack_390[*(long *)(local_3b0._M_dataplus._M_p + -0x18)] & 5) == 0)) {
            cVar3 = std::__basic_file<char>::is_open();
            if (cVar3 == '\0') {
              input_stream = (string *)&std::cin;
            }
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_5d0,(long)local_5fc,(allocator_type *)local_1a8);
            iVar4 = 0;
            goto LAB_00102d01;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Cannot open file ",0x11);
          sVar5 = strlen(__s_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s_00,sVar5);
          local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"extract","");
          sptk::PrintErrorMessage(&local_5f0,(ostringstream *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
            operator_delete(local_5f0._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          iVar4 = 1;
          goto LAB_00102df8;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"Cannot open file ",0x11);
        if (__s == (char *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffff9f8 +
                          (int)*(undefined8 *)(local_3b0._M_dataplus._M_p + -0x18) + 600);
        }
        else {
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b0,__s,sVar5);
        }
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"extract","");
        sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3b0);
        std::ios_base::~ios_base(local_340);
        iVar4 = 1;
        goto LAB_00102e05;
      }
    case 0x6a:
    case 0x6b:
      anon_unknown.dwarf_2bfd::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
  } while( true );
switchD_001026ed_caseD_6c:
  std::__cxx11::string::string((string *)&local_5b8,ya_optarg,(allocator *)&local_3b0);
  bVar6 = sptk::ConvertStringToInteger(&local_5b8,&local_5fc);
  bVar2 = local_5fc < 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p);
  }
  if (!bVar6 || bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_5b8,"The argument for the -l option must be a positive integer",
               0x39);
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"extract","");
    sptk::PrintErrorMessage(&local_3b0,(ostringstream *)&local_5b8);
LAB_00102ae0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5b8);
    std::ios_base::~ios_base(local_548);
    return 1;
  }
  goto LAB_001026c4;
  while ((local_5f4 != local_5f8 ||
         (bVar2 = sptk::WriteStream<double>(0,local_5fc,&local_5d0,(ostream *)&std::cout,(int *)0x0)
         , bVar2))) {
LAB_00102d01:
    bVar2 = sptk::ReadStream<int>(&local_5f4,(istream *)&local_5b8);
    if ((!bVar2) ||
       (bVar2 = sptk::ReadStream<double>
                          (false,0,0,local_5fc,&local_5d0,(istream *)input_stream,(int *)0x0),
       !bVar2)) goto LAB_00102de9;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Failed to write extracted vector",0x20);
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"extract","");
  sptk::PrintErrorMessage(&local_5f0,(ostringstream *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar4 = 1;
LAB_00102de9:
  if (local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_5d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00102df8:
  std::ifstream::~ifstream(&local_3b0);
LAB_00102e05:
  std::ifstream::~ifstream(&local_5b8);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  int codebook_index(kDefaultCodebookIndex);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:i:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("extract", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("extract", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &codebook_index) ||
            codebook_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("extract", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  // Get input file names.
  const char* index_file;
  const char* input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    index_file = argv[argc - 2];
    input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    index_file = argv[argc - 1];
    input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, idxfile and infile, are required";
    sptk::PrintErrorMessage("extract", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("extract", error_message);
    return 1;
  }

  // Open stream for reading index sequence.
  std::ifstream ifs1;
  ifs1.open(index_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << index_file;
    sptk::PrintErrorMessage("extract", error_message);
    return 1;
  }
  std::istream& stream_for_index(ifs1);

  // Open stream for reading input sequence.
  std::ifstream ifs2;
  if (NULL != input_file) {
    ifs2.open(input_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("extract", error_message);
      return 1;
    }
  }
  std::istream& stream_for_input(ifs2.is_open() ? ifs2 : std::cin);

  int index;
  std::vector<double> input_vector(vector_length);

  while (sptk::ReadStream(&index, &stream_for_index) &&
         sptk::ReadStream(false, 0, 0, vector_length, &input_vector,
                          &stream_for_input, NULL)) {
    if (index == codebook_index) {
      if (!sptk::WriteStream(0, vector_length, input_vector, &std::cout,
                             NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write extracted vector";
        sptk::PrintErrorMessage("extract", error_message);
        return 1;
      }
    }
  }

  return 0;
}